

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InlinePass::InlineSingleInstruction
          (InlinePass *this,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,BasicBlock *new_blk_ptr,Instruction *inst,uint32_t dbg_inlined_at)

{
  uint32_t uVar1;
  Instruction *this_00;
  const_iterator cVar2;
  DecorationManager *this_01;
  uint32_t rid;
  undefined4 uStack_4c;
  undefined8 local_48;
  _Manager_type local_40;
  code *local_38;
  
  if (1 < inst->opcode_ - OpReturn) {
    this_00 = Instruction::Clone(inst,(this->super_Pass).context_);
    local_48 = 0;
    local_38 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp:354:24)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp:354:24)>
               ::_M_manager;
    _rid = callee2caller;
    Instruction::ForEachInId(this_00,(function<void_(unsigned_int_*)> *)&rid);
    if (local_40 != (_Manager_type)0x0) {
      (*local_40)((_Any_data *)&rid,(_Any_data *)&rid,__destroy_functor);
    }
    uVar1 = Instruction::result_id(this_00);
    rid = uVar1;
    if (uVar1 != 0) {
      cVar2 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&callee2caller->_M_h,&rid);
      if (cVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
          == (__node_type *)0x0) {
        (*(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])
                  (this_00);
        return false;
      }
      uVar1 = *(uint32_t *)
               ((long)cVar2.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur + 0xc);
      Instruction::SetResultId(this_00,uVar1);
      this_01 = Pass::get_decoration_mgr(&this->super_Pass);
      analysis::DecorationManager::CloneDecorations(this_01,rid,uVar1);
    }
    Instruction::UpdateDebugInlinedAt(this_00,dbg_inlined_at);
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
              (&this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>,
               &(new_blk_ptr->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_);
  }
  return true;
}

Assistant:

bool InlinePass::InlineSingleInstruction(
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    BasicBlock* new_blk_ptr, const Instruction* inst, uint32_t dbg_inlined_at) {
  // If we have return, it must be at the end of the callee. We will handle
  // it at the end.
  if (inst->opcode() == spv::Op::OpReturnValue ||
      inst->opcode() == spv::Op::OpReturn)
    return true;

  // Copy callee instruction and remap all input Ids.
  std::unique_ptr<Instruction> cp_inst(inst->Clone(context()));
  cp_inst->ForEachInId([&callee2caller](uint32_t* iid) {
    const auto mapItr = callee2caller.find(*iid);
    if (mapItr != callee2caller.end()) {
      *iid = mapItr->second;
    }
  });

  // If result id is non-zero, remap it.
  const uint32_t rid = cp_inst->result_id();
  if (rid != 0) {
    const auto mapItr = callee2caller.find(rid);
    if (mapItr == callee2caller.end()) {
      return false;
    }
    uint32_t nid = mapItr->second;
    cp_inst->SetResultId(nid);
    get_decoration_mgr()->CloneDecorations(rid, nid);
  }

  cp_inst->UpdateDebugInlinedAt(dbg_inlined_at);
  new_blk_ptr->AddInstruction(std::move(cp_inst));
  return true;
}